

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O1

void __thiscall LLVMBC::StreamState::append(StreamState *this,AllocaInst *alloca,bool decl)

{
  TypeID TVar1;
  PointerType *this_00;
  LoggingCallback p_Var2;
  void *pvVar3;
  undefined7 in_register_00000011;
  uint64_t local_1020;
  Type *local_1018;
  undefined5 uStack_1010;
  undefined3 uStack_100b;
  undefined5 uStack_1008;
  char acStack_1003 [4083];
  
  if ((int)CONCAT71(in_register_00000011,decl) == 0) {
    local_1018 = (Type *)Value::get_tween_id((Value *)alloca);
    append<char_const(&)[2],unsigned_long>(this,(char (*) [2])0x1c9936,(unsigned_long *)&local_1018)
    ;
  }
  else {
    local_1020 = Value::get_tween_id((Value *)alloca);
    this_00 = (PointerType *)Value::getType((Value *)alloca);
    TVar1 = Type::getTypeID((Type *)this_00);
    if (TVar1 != PointerTyID) {
      p_Var2 = ::dxil_spv::get_thread_log_callback();
      if (p_Var2 == (LoggingCallback)0x0) {
        append();
        std::terminate();
      }
      uStack_1008 = 0x6163206e69;
      builtin_strncpy(acStack_1003,"st<T>.\n",8);
      local_1018 = (Type *)0x2064696c61766e49;
      uStack_1010 = 0x2065707974;
      uStack_100b = 0x204449;
      pvVar3 = ::dxil_spv::get_thread_log_callback_userdata();
      (*p_Var2)(pvVar3,Error,(char *)&local_1018);
      std::terminate();
    }
    local_1018 = PointerType::getElementType(this_00);
    append<char_const(&)[2],unsigned_long,char_const(&)[11],LLVMBC::Type*>
              (this,(char (*) [2])0x1c9936,&local_1020,(char (*) [11])" = alloca ",&local_1018);
  }
  return;
}

Assistant:

void StreamState::append(AllocaInst *alloca, bool decl)
{
	if (decl)
	{
		append("%", alloca->get_tween_id(), " = alloca ", cast<PointerType>(alloca->getType())->getElementType());
	}
	else
	{
		append("%", alloca->get_tween_id());
	}
}